

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::BrotliDecoderAttachDictionary
              (BrotliDecoderStateInternal *state,BrotliSharedDictionaryType type,size_t data_size,
              uint8_t *data)

{
  BrotliSharedDictionaryInternal *pBVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  BrotliDecoderCompoundDictionary *pBVar5;
  int iVar6;
  ulong uVar7;
  
  iVar6 = 0;
  if (state->state == BROTLI_STATE_UNINITED) {
    uVar7 = (ulong)state->dictionary->num_prefix;
    iVar4 = BrotliSharedDictionaryAttach(state->dictionary,type,data_size,data);
    iVar6 = 0;
    if (iVar4 != 0) {
      for (; pBVar1 = state->dictionary, uVar7 < pBVar1->num_prefix; uVar7 = uVar7 + 1) {
        if (state->state != BROTLI_STATE_UNINITED) {
          return 0;
        }
        sVar2 = pBVar1->prefix_size[uVar7];
        puVar3 = pBVar1->prefix[uVar7];
        pBVar5 = state->compound_dictionary;
        if (pBVar5 == (BrotliDecoderCompoundDictionary *)0x0) {
          pBVar5 = (BrotliDecoderCompoundDictionary *)
                   (*state->alloc_func)(state->memory_manager_opaque,0x1e0);
          if (pBVar5 == (BrotliDecoderCompoundDictionary *)0x0) {
            return 0;
          }
          pBVar5->num_chunks = 0;
          pBVar5->total_size = 0;
          pBVar5->br_length = 0;
          pBVar5->br_copied = 0;
          pBVar5->block_bits = -1;
          pBVar5->chunk_offsets[0] = 0;
          state->compound_dictionary = pBVar5;
          iVar4 = 0;
          iVar6 = 0;
        }
        else {
          iVar6 = pBVar5->num_chunks;
          if (iVar6 == 0xf) {
            return 0;
          }
          iVar4 = pBVar5->total_size;
        }
        pBVar5->chunks[iVar6] = puVar3;
        pBVar5->num_chunks = iVar6 + 1;
        iVar4 = (int)sVar2 + iVar4;
        pBVar5->total_size = iVar4;
        pBVar5->chunk_offsets[(long)iVar6 + 1] = iVar4;
      }
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

BROTLI_BOOL BrotliDecoderAttachDictionary(BrotliDecoderState *state, BrotliSharedDictionaryType type, size_t data_size,
                                          const uint8_t data[BROTLI_ARRAY_PARAM(data_size)]) {
	brotli_reg_t i;
	brotli_reg_t num_prefix_before = state->dictionary->num_prefix;
	if (state->state != BROTLI_STATE_UNINITED)
		return BROTLI_FALSE;
	if (!BrotliSharedDictionaryAttach(state->dictionary, type, data_size, data)) {
		return BROTLI_FALSE;
	}
	for (i = num_prefix_before; i < state->dictionary->num_prefix; i++) {
		if (!AttachCompoundDictionary(state, state->dictionary->prefix[i], state->dictionary->prefix_size[i])) {
			return BROTLI_FALSE;
		}
	}
	return BROTLI_TRUE;
}